

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void gold_update(void)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long gold;
  long mob_gold;
  CHAR_DATA *mob;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  CHAR_DATA *local_8;
  
  if (total_wealth != 0) {
    for (local_8 = char_list; local_8 != (CHAR_DATA *)0x0; local_8 = local_8->next) {
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if ((bVar1) && ((local_8->stolen_from & 1U) == 0)) {
        local_20 = total_gold - player_gold;
        local_28 = 100000;
        plVar3 = std::max<long>(&local_20,&local_28);
        local_10 = *plVar3;
        iVar2 = local_8->pIndexData->wealth;
        local_18 = (long)iVar2 * (local_10 / total_wealth);
        if (9 < local_18) {
          iVar2 = number_range(iVar2,in_stack_ffffffffffffffcc);
          local_18 = (long)iVar2;
        }
        if (local_18 < 0) {
          local_18 = 0;
        }
        local_8->gold = local_18;
      }
    }
  }
  return;
}

Assistant:

void gold_update(void)
{
	CHAR_DATA *mob;
	long mob_gold;
	long gold;

	if (total_wealth == 0)
		return;

	for (mob = char_list; mob; mob = mob->next)
	{
		if (!is_npc(mob) || mob->stolen_from)
			continue;

		mob_gold = std::max(total_gold - player_gold, (long)100000);
		gold = mob->pIndexData->wealth * (mob_gold / total_wealth);

		if (gold > 9)
			gold = number_range((int)((float)gold * 0.75), (int)((float)gold * 1.25));

		if (gold < 0)
			gold = 0;

		mob->gold = gold;
	}
}